

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O2

void helper_palignr_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s,int32_t shift)

{
  uint uVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  uint64_t uVar5;
  uint uVar6;
  ulong uVar7;
  
  if (0x1f < shift) {
    uVar3 = 0;
    uVar5 = 0;
    goto LAB_004d1f24;
  }
  uVar1 = shift * 8;
  uVar6 = shift * 8 + 0x3f;
  bVar2 = (byte)uVar1;
  if (uVar6 < 0x7f) {
    if (shift << 3 < 1) {
      uVar3 = s->_q_ZMMReg[0] << (-bVar2 & 0x3f);
    }
    else {
      uVar3 = s->_q_ZMMReg[0] >> (bVar2 & 0x3f);
    }
  }
  else {
    uVar3 = 0;
  }
  if (uVar1 - 1 < 0x7f) {
    if (uVar1 < 0x41) {
      uVar4 = s->_q_ZMMReg[1] << (-bVar2 & 0x3f);
    }
    else {
      uVar4 = s->_q_ZMMReg[1] >> (bVar2 - 0x40 & 0x3f);
    }
  }
  else {
    uVar4 = 0;
  }
  if (uVar1 - 0x41 < 0x7f) {
    if (uVar1 < 0x81) {
      uVar7 = d->_q_ZMMReg[0] << (-bVar2 & 0x3f);
    }
    else {
      uVar7 = d->_q_ZMMReg[0] >> (bVar2 + 0x80 & 0x3f);
    }
  }
  else {
    uVar7 = 0;
  }
  uVar5 = uVar4 | uVar3 | uVar7;
  if (uVar1 - 0x81 < 0x7f) {
    uVar3 = d->_q_ZMMReg[1] >> (bVar2 & 0x3f);
    if (uVar1 < 0xc1) {
      uVar3 = d->_q_ZMMReg[1] << (-bVar2 - 0x40 & 0x3f);
    }
    uVar5 = uVar5 | uVar3;
LAB_004d1eb2:
    if (uVar6 < 0x7f) {
      if (0 < shift << 3) {
        uVar4 = s->_q_ZMMReg[1] >> (bVar2 & 0x3f);
        goto LAB_004d1eca;
      }
      uVar3 = 0;
LAB_004d1f0b:
      uVar3 = s->_q_ZMMReg[1] << (-bVar2 & 0x3f) | uVar3;
    }
    else {
      uVar4 = 0;
LAB_004d1eca:
      if (uVar1 - 1 < 0x7f) {
        if ((int)uVar1 < 0x41) {
          uVar3 = d->_q_ZMMReg[0] << (-bVar2 & 0x3f) | uVar4;
          goto LAB_004d1f19;
        }
        uVar3 = d->_q_ZMMReg[0] >> (bVar2 - 0x40 & 0x3f);
      }
      else {
        uVar3 = 0;
      }
      uVar3 = uVar3 | uVar4;
      if (uVar1 - 0x41 < 0x7f) {
        if ((int)uVar1 < 0x81) {
          uVar4 = d->_q_ZMMReg[1] << (-bVar2 & 0x3f);
        }
        else {
          uVar4 = d->_q_ZMMReg[1] >> (bVar2 + 0x80 & 0x3f);
        }
        goto LAB_004d1f1b;
      }
    }
LAB_004d1f19:
    uVar4 = 0;
  }
  else {
    if (uVar1 < 0xffffff81) goto LAB_004d1eb2;
    if (-0x40 < (int)uVar1) {
      uVar3 = s->_q_ZMMReg[0] >> (bVar2 + 0x40 & 0x3f);
      goto LAB_004d1f0b;
    }
    uVar3 = s->_q_ZMMReg[0] << (-bVar2 & 0x3f);
    uVar4 = 0;
  }
LAB_004d1f1b:
  uVar3 = uVar3 | uVar4;
LAB_004d1f24:
  d->_q_ZMMReg[0] = uVar5;
  d->_q_ZMMReg[1] = uVar3;
  return;
}

Assistant:

void glue(helper_palignr, SUFFIX)(CPUX86State *env, Reg *d, Reg *s,
                                  int32_t shift)
{
    Reg r;

    /* XXX could be checked during translation */
    if (shift >= (16 << SHIFT)) {
        r.Q(0) = 0;
        XMM_ONLY(r.Q(1) = 0);
    } else {
        shift <<= 3;
#define SHR(v, i) (i < 64 && i > -64 ? i > 0 ? v >> (i) : (v << -(i)) : 0)
#if SHIFT == 0
        r.Q(0) = SHR(s->Q(0), shift - 0) |
            SHR(d->Q(0), shift -  64);
#else
        r.Q(0) = SHR(s->Q(0), shift - 0) |
            SHR(s->Q(1), shift -  64) |
            SHR(d->Q(0), shift - 128) |
            SHR(d->Q(1), shift - 192);
        r.Q(1) = SHR(s->Q(0), shift + 64) |
            SHR(s->Q(1), shift -   0) |
            SHR(d->Q(0), shift -  64) |
            SHR(d->Q(1), shift - 128);
#endif
#undef SHR
    }

    *d = r;
}